

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O2

void __thiscall
Memory::Recycler::RegisterPendingWriteBarrierBlock(Recycler *this,void *address,size_t bytes)

{
  void *local_30;
  void *address_local;
  size_t bytes_local;
  
  if (DAT_0145c43e == '\x01') {
    local_30 = address;
    address_local = (void *)bytes;
    WBSetBitRange((char *)address,(uint)(bytes >> 3) & 0x1fffffff);
    JsUtil::
    BaseDictionary<void*,unsigned_long,Memory::HeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,RecyclerPointerComparer,JsUtil::SimpleDictionaryEntry,JsUtil::AsymetricResizeLock>
    ::
    Insert<(JsUtil::BaseDictionary<void*,unsigned_long,Memory::HeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,RecyclerPointerComparer,JsUtil::SimpleDictionaryEntry,JsUtil::AsymetricResizeLock>::InsertOperations)2>
              ((BaseDictionary<void*,unsigned_long,Memory::HeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,RecyclerPointerComparer,JsUtil::SimpleDictionaryEntry,JsUtil::AsymetricResizeLock>
                *)&this->pendingWriteBarrierBlockMap,&local_30,(unsigned_long *)&address_local);
    RecyclerWriteBarrierManager::WriteBarrier(local_30,(size_t)address_local);
  }
  return;
}

Assistant:

void
Recycler::RegisterPendingWriteBarrierBlock(void* address, size_t bytes)
{
    if (CONFIG_FLAG(ForceSoftwareWriteBarrier))
    {
#if DBG
        WBSetBitRange((char*)address, (uint)bytes/sizeof(void*));
#endif
        pendingWriteBarrierBlockMap.Item(address, bytes);
        RecyclerWriteBarrierManager::WriteBarrier(address, bytes);
    }
}